

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

char * ply_get_next_obj_info(p_ply ply,char *last)

{
  char *last_local;
  p_ply ply_local;
  char *local_8;
  
  if (last == (char *)0x0) {
    local_8 = ply->obj_info;
  }
  else {
    local_8 = last + 0x400;
    if (ply->obj_info + ply->nobj_infos * 0x400 <= local_8) {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char *ply_get_next_obj_info(p_ply ply, const char *last) {
    assert(ply);
    if (!last) return ply->obj_info;
    last += LINESIZE;
    if (last < ply->obj_info + LINESIZE * ply->nobj_infos)
        return last;
    else
        return NULL;
}